

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

StatementSyntax * __thiscall
slang::parsing::Parser::parseRandSequenceStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  ProductionSyntax *pPVar4;
  SourceLocation location;
  undefined4 extraout_var;
  RandSequenceStatementSyntax *pRVar5;
  Token randsequence;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token TVar9;
  Token TVar10;
  SmallVector<slang::syntax::ProductionSyntax_*,_5UL> productions;
  SmallVectorBase<slang::syntax::ProductionSyntax_*> local_120 [2];
  Token local_e0;
  Token local_d0;
  Token local_c0;
  Token local_b0;
  Token local_a0;
  SyntaxNode *local_90;
  SyntaxNode *pSStack_88;
  size_t local_80;
  pointer local_78;
  __extent_storage<18446744073709551615UL> local_70;
  SyntaxList<slang::syntax::ProductionSyntax> local_68;
  
  randsequence = ParserBase::consume(&this->super_ParserBase);
  TVar6 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  TVar7 = ParserBase::consumeIf(&this->super_ParserBase,Identifier);
  TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_120[0].data_ = (pointer)local_120[0].firstElement;
  local_120[0].len = 0;
  local_120[0].cap = 5;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = slang::syntax::SyntaxFacts::isPossibleDataType(TVar9.kind);
    if (!bVar2) break;
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    pPVar4 = parseProduction(this);
    local_a0._0_8_ = pPVar4;
    SmallVectorBase<slang::syntax::ProductionSyntax*>::
    emplace_back<slang::syntax::ProductionSyntax*>
              ((SmallVectorBase<slang::syntax::ProductionSyntax*> *)local_120,
               (ProductionSyntax **)&local_a0);
    pSVar1 = this->previewNode;
    this->previewNode = (SyntaxNode *)0x0;
    *(SyntaxNode **)(*(long *)((long)local_120[0].data_ + (local_120[0].len - 1) * 8) + 0x10) =
         pSVar1;
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    if (TVar9.info == TVar10.info && TVar9.kind == TVar10.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
    }
  }
  if (local_120[0].len == 0) {
    local_a0 = ParserBase::peek(&this->super_ParserBase);
    location = Token::location(&local_a0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4f0005,location);
  }
  TVar9 = ParserBase::expect(&this->super_ParserBase,EndSequenceKeyword);
  local_a0.info._0_4_ = 1;
  local_90 = (SyntaxNode *)0x0;
  pSStack_88 = (SyntaxNode *)0x0;
  local_a0._0_8_ = &PTR_getChild_006d0388;
  local_80 = attributes._M_extent._M_extent_value._M_extent_value;
  local_78 = attributes._M_ptr;
  local_70._M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  local_d0 = TVar8;
  local_c0 = TVar7;
  local_b0 = TVar6;
  iVar3 = SmallVectorBase<slang::syntax::ProductionSyntax_*>::copy
                    (local_120,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                     (EVP_PKEY_CTX *)TVar9.info);
  local_68.super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006d1778;
  local_e0 = TVar9;
  pRVar5 = slang::syntax::SyntaxFactory::randSequenceStatement
                     (&this->factory,label,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_a0,randsequence,
                      local_b0,local_c0,local_d0,&local_68,TVar9);
  if (local_120[0].data_ != (pointer)local_120[0].firstElement) {
    operator_delete(local_120[0].data_);
  }
  return &pRVar5->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseRandSequenceStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto firstProd = consumeIf(TokenKind::Identifier);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<ProductionSyntax*> productions;
    while (isPossibleDataType(peek().kind)) {
        auto curr = peek();
        productions.push_back(&parseProduction());
        productions.back()->previewNode = std::exchange(previewNode, nullptr);

        // If there are no consumed tokens then production was not parsed.
        if (curr == peek())
            skipToken(std::nullopt);
    }

    if (productions.empty())
        addDiag(diag::ExpectedRsRule, peek().location());

    auto endsequence = expect(TokenKind::EndSequenceKeyword);
    return factory.randSequenceStatement(label, attributes, keyword, openParen, firstProd,
                                         closeParen, productions.copy(alloc), endsequence);
}